

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::EmitNonDefaultCheckForString
          (anon_unknown_0 *this,Printer *p,string_view prefix,FieldDescriptor *field,bool split,
          Options *opts,AnyInvocable<void_()> *emit_body)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  FieldDescriptor *pFVar1;
  bool bVar2;
  CppType CVar3;
  LogMessage *pLVar4;
  undefined7 in_register_00000089;
  Sub *local_3f8;
  basic_string_view<char,_std::char_traits<char>_> local_3a0;
  undefined1 local_389;
  anon_class_32_4_682aa1c1_for_cb local_388;
  allocator<char> local_361;
  string local_360;
  anon_class_8_1_4d41d52e_for_cb local_340;
  allocator<char> local_331;
  string local_330;
  anon_class_24_3_dc66db61_for_cb local_310;
  allocator<char> local_2f1;
  string local_2f0;
  Sub *local_2d0;
  Sub local_2c8;
  Sub local_210;
  Sub local_158;
  iterator local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_90;
  undefined1 local_79;
  LogMessage local_78;
  Voidify local_65 [20];
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  Options *local_38;
  Options *opts_local;
  undefined8 uStack_28;
  bool split_local;
  FieldDescriptor *field_local;
  Printer *p_local;
  string_view prefix_local;
  
  uStack_28 = prefix._M_str;
  prefix_local._M_len = prefix._M_len;
  opts_local._7_1_ = (byte)field & 1;
  local_38 = (Options *)CONCAT71(in_register_00000089,split);
  field_local = (FieldDescriptor *)this;
  p_local = p;
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)uStack_28);
  local_51 = 0;
  if (CVar3 != CPPTYPE_STRING) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
               ,0x128,"field->cpp_type() == FieldDescriptor::CPPTYPE_STRING");
    local_51 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar4);
  }
  if ((local_51 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  bVar2 = IsArenaStringPtr((FieldDescriptor *)uStack_28,local_38);
  local_79 = 0;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
               ,0x129,"IsArenaStringPtr(field, opts)");
    local_79 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_65,pLVar4);
  }
  pFVar1 = field_local;
  if ((local_79 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_78);
  }
  local_389 = 1;
  local_2d0 = &local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"condition",&local_2f1);
  local_310.p = (Printer **)&field_local;
  local_310.prefix = (string_view *)&p_local;
  local_310.field = (FieldDescriptor **)&stack0xffffffffffffffd8;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::EmitNonDefaultCheckForString(google::protobuf::io::Printer*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptor_const*,bool,google::protobuf::compiler::cpp::Options_const&,absl::lts_20250127::AnyInvocable<void()>)::__0>
            (&local_2c8,&local_2f0,&local_310);
  local_2d0 = &local_210;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"emit_body",&local_331);
  local_340.emit_body = (AnyInvocable<void_()> *)opts;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::EmitNonDefaultCheckForString(google::protobuf::io::Printer*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptor_const*,bool,google::protobuf::compiler::cpp::Options_const&,absl::lts_20250127::AnyInvocable<void()>)::__1>
            (&local_210,&local_330,&local_340);
  local_2d0 = &local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"set_empty_string",&local_361);
  local_388.p = (Printer **)&field_local;
  local_388.prefix = (string_view *)&p_local;
  local_388.field = (FieldDescriptor **)&stack0xffffffffffffffd8;
  local_388.split = (bool *)((long)&opts_local + 7);
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::EmitNonDefaultCheckForString(google::protobuf::io::Printer*,std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptor_const*,bool,google::protobuf::compiler::cpp::Options_const&,absl::lts_20250127::AnyInvocable<void()>)::__2>
            (&local_158,&local_360,&local_388);
  local_389 = 0;
  local_a0 = &local_2c8;
  local_98 = 3;
  v._M_len = 3;
  v._M_array = local_a0;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_90._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_3a0,
             "\n        if ($condition$) {\n          $emit_body$;\n        } else {\n          $set_empty_string$;\n        }\n      "
            );
  io::Printer::SourceLocation::current();
  io::Printer::Emit((Printer *)pFVar1,local_90._M_allocated_capacity,local_90._8_8_,local_3a0._M_len
                    ,local_3a0._M_str);
  local_3f8 = (Sub *)&local_a0;
  do {
    local_3f8 = local_3f8 + -1;
    io::Printer::Sub::~Sub(local_3f8);
  } while (local_3f8 != &local_2c8);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  return;
}

Assistant:

void EmitNonDefaultCheckForString(io::Printer* p, absl::string_view prefix,
                                  const FieldDescriptor* field, bool split,
                                  const Options& opts,
                                  absl::AnyInvocable<void()> emit_body) {
  ABSL_DCHECK(field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);
  ABSL_DCHECK(IsArenaStringPtr(field, opts));
  p->Emit(
      {
          {"condition", [&] { EmitNonDefaultCheck(p, prefix, field); }},
          {"emit_body", [&] { emit_body(); }},
          {"set_empty_string",
           [&] {
             p->Emit(
                 {
                     {"prefix", prefix},
                     {"name", FieldName(field)},
                     {"field", FieldMemberName(field, split)},
                 },
                 // The merge semantic is "overwrite if present". This statement
                 // is emitted when hasbit is set and src proto field is
                 // nonpresent (i.e. an empty string). Now, the destination
                 // string can be either empty or nonempty.
                 // - If dst is empty and pointing to the default instance,
                 //   allocate a new empty instance.
                 // - If dst is already pointing to a nondefault instance,
                 //   do nothing.
                 // This will allow destructors and Clear() to be simpler.
                 R"cc(
                   if (_this->$field$.IsDefault()) {
                     _this->_internal_set_$name$("");
                   }
                 )cc");
           }},
      },
      R"cc(
        if ($condition$) {
          $emit_body$;
        } else {
          $set_empty_string$;
        }
      )cc");
}